

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall QDataWidgetMapperPrivate::QDataWidgetMapperPrivate(QDataWidgetMapperPrivate *this)

{
  QAbstractItemModel *pQVar1;
  long lVar2;
  
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QDataWidgetMapperPrivate_0081b928;
  pQVar1 = (QAbstractItemModel *)QAbstractItemModelPrivate::staticEmptyModel();
  this->model = pQVar1;
  lVar2 = 0;
  this->delegate = (QAbstractItemDelegate *)0x0;
  this->orientation = Horizontal;
  this->submitPolicy = AutoSubmit;
  QPersistentModelIndex::QPersistentModelIndex(&this->rootIndex);
  QPersistentModelIndex::QPersistentModelIndex(&this->currentTopLeft);
  (this->widgetMap).
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->widgetMap).
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->widgetMap).
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    QMetaObject::Connection::Connection
              ((Connection *)((long)&(this->modelConnections)._M_elems[0].d_ptr + lVar2));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  lVar2 = 0;
  do {
    QMetaObject::Connection::Connection
              ((Connection *)((long)&(this->delegateConnections)._M_elems[0].d_ptr + lVar2));
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

QDataWidgetMapperPrivate()
        : model(QAbstractItemModelPrivate::staticEmptyModel()), delegate(nullptr),
          orientation(Qt::Horizontal), submitPolicy(QDataWidgetMapper::AutoSubmit)
    {
    }